

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::compressPieceTable(QTextDocumentPrivate *this)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QChar *pQVar4;
  QTextFragmentData *pQVar5;
  long in_RDI;
  long in_FS_OFFSET;
  int newLen;
  QChar *newTextPtr;
  bool compressTable;
  uint garbageCollectionThreshold;
  QString newText;
  Iterator it;
  Iterator *in_stack_ffffffffffffff80;
  QFragmentMap<QTextFragmentData> *in_stack_ffffffffffffff88;
  int local_4c;
  Iterator *local_48;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0xb8) & 1) == 0) {
    bVar1 = false;
    if (0x18000 < (ulong)*(uint *)(in_RDI + 0x98) * 2) {
      qVar2 = QString::size((QString *)(in_RDI + 0x80));
      qVar3 = QString::capacity((QString *)0x7d5b6d);
      bVar1 = (double)qVar3 * 0.9 <= (double)qVar2;
    }
    if (bVar1) {
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x7d5bd3);
      QString::size((QString *)(in_RDI + 0x80));
      QString::resize((longlong)&local_30);
      local_48 = (Iterator *)QString::data((QString *)in_stack_ffffffffffffff80);
      local_4c = 0;
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFragmentMap<QTextFragmentData>::begin(in_stack_ffffffffffffff88);
      while (bVar1 = QFragmentMap<QTextFragmentData>::Iterator::atEnd((Iterator *)local_18),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff80 = local_48;
        pQVar4 = QString::constData((QString *)0x7d5c66);
        pQVar5 = QFragmentMap<QTextFragmentData>::Iterator::operator->((Iterator *)0x7d5c74);
        pQVar4 = pQVar4 + pQVar5->stringPosition;
        pQVar5 = QFragmentMap<QTextFragmentData>::Iterator::operator->((Iterator *)0x7d5c94);
        memcpy(in_stack_ffffffffffffff80,pQVar4,
               (ulong)(pQVar5->super_QFragment<1>).size_array[0] << 1);
        pQVar5 = QFragmentMap<QTextFragmentData>::Iterator::operator->((Iterator *)0x7d5cbd);
        pQVar5->stringPosition = local_4c;
        pQVar5 = QFragmentMap<QTextFragmentData>::Iterator::operator->((Iterator *)0x7d5cce);
        local_48 = (Iterator *)
                   ((long)&local_48->pt + (ulong)(pQVar5->super_QFragment<1>).size_array[0] * 2);
        pQVar5 = QFragmentMap<QTextFragmentData>::Iterator::operator->((Iterator *)0x7d5ced);
        local_4c = (pQVar5->super_QFragment<1>).size_array[0] + local_4c;
        QFragmentMap<QTextFragmentData>::Iterator::operator++(in_stack_ffffffffffffff80);
      }
      QString::resize((longlong)&local_30);
      QString::squeeze((QString *)in_stack_ffffffffffffff80);
      QString::operator=((QString *)(in_RDI + 0x80),(QString *)&local_30);
      *(undefined4 *)(in_RDI + 0x98) = 0;
      QString::~QString((QString *)0x7d5d4f);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::compressPieceTable()
{
    if (undoEnabled)
        return;

    const uint garbageCollectionThreshold = 96 * 1024; // bytes

    //qDebug() << "unreachable bytes:" << unreachableCharacterCount * sizeof(QChar) << " -- limit" << garbageCollectionThreshold << "text size =" << text.size() << "capacity:" << text.capacity();

    bool compressTable = unreachableCharacterCount * sizeof(QChar) > garbageCollectionThreshold
                         && text.size() >= text.capacity() * 0.9;
    if (!compressTable)
        return;

    QString newText;
    newText.resize(text.size());
    QChar *newTextPtr = newText.data();
    int newLen = 0;

    for (FragmentMap::Iterator it = fragments.begin(); !it.atEnd(); ++it) {
        memcpy(newTextPtr, text.constData() + it->stringPosition, it->size_array[0] * sizeof(QChar));
        it->stringPosition = newLen;
        newTextPtr += it->size_array[0];
        newLen += it->size_array[0];
    }

    newText.resize(newLen);
    newText.squeeze();
    //qDebug() << "removed" << text.size() - newText.size() << "characters";
    text = newText;
    unreachableCharacterCount = 0;
}